

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O3

void OpenSteer::OpenSteerDemo::gridUtility(Vec3 *gridTarget)

{
  float fVar1;
  float fVar2;
  Vec3 gridCenter;
  Color gray2;
  Color gray1;
  Vec3 local_44;
  Color local_38;
  Color local_28;
  
  fVar1 = roundf(gridTarget->x * 0.5);
  fVar2 = roundf(gridTarget->y * 0.5);
  local_44.z = roundf(gridTarget->z * 0.5);
  local_44.z = local_44.z + local_44.z;
  local_44.x = fVar1 + fVar1;
  local_44.y = fVar2 + fVar2 + -0.05;
  Color::Color(&local_28,0.27);
  Color::Color(&local_38,0.3);
  drawXZCheckerboardGrid(50.0,0x32,&local_44,&local_28,&local_38);
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::gridUtility (const Vec3& gridTarget)
{
    // round off target to the nearest multiple of 2 (because the
    // checkboard grid with a pitch of 1 tiles with a period of 2)
    // then lower the grid a bit to put it under 2d annotation lines
    const Vec3 gridCenter ((round (gridTarget.x * 0.5f) * 2),
                           (round (gridTarget.y * 0.5f) * 2) - .05f,
                           (round (gridTarget.z * 0.5f) * 2));

    // colors for checkboard
    const Color gray1(0.27f);
    const Color gray2(0.30f);

    // draw 50x50 checkerboard grid with 50 squares along each side
    drawXZCheckerboardGrid (50, 50, gridCenter, gray1, gray2);

    // alternate style
    // drawXZLineGrid (50, 50, gridCenter, gBlack);
}